

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionRotation_spline.cpp
# Opt level: O3

void __thiscall
chrono::ChFunctionRotation_spline::SetClosed(ChFunctionRotation_spline *this,bool mc)

{
  ChVectorDynamic<> *pCVar1;
  pointer pCVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  long lVar6;
  pointer pCVar7;
  size_type sVar8;
  ulong uVar9;
  
  if (this->closed != mc) {
    if (mc) {
      sVar8 = (long)this->p +
              ((long)(this->rotations).
                     super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->rotations).
                     super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5);
      std::vector<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>::
      resize(&this->rotations,sVar8);
      pCVar1 = &this->knots;
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                (&pCVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                 (long)this->p + 1 + sVar8);
      lVar6 = (this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
              .m_rows;
      if (lVar6 < 0) {
LAB_0089bf70:
        __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                      ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                     );
      }
      if (lVar6 != 0) {
        memset((pCVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data,0,lVar6 << 3);
      }
      geometry::ChBasisToolsBspline::ComputeKnotUniform(pCVar1,this->p,0.0,1.0);
      lVar6 = (long)this->p;
      if (0 < lVar6) {
        pCVar7 = (this->rotations).
                 super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar9 = sVar8 - lVar6;
        do {
          if ((uVar9 & 0x7ffffffffffffff) != 0) {
            dVar3 = pCVar7->m_data[1];
            dVar4 = pCVar7->m_data[2];
            dVar5 = pCVar7->m_data[3];
            pCVar2 = pCVar7 + uVar9;
            pCVar2->m_data[0] = pCVar7->m_data[0];
            pCVar2->m_data[1] = dVar3;
            pCVar2->m_data[2] = dVar4;
            pCVar2->m_data[3] = dVar5;
          }
          pCVar7 = pCVar7 + 1;
          lVar6 = lVar6 + -1;
        } while (lVar6 != 0);
      }
    }
    else {
      sVar8 = ((long)(this->rotations).
                     super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->rotations).
                     super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5) - (long)this->p;
      std::vector<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>::
      resize(&this->rotations,sVar8);
      pCVar1 = &this->knots;
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                (&pCVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                 (long)this->p + 1 + sVar8);
      lVar6 = (this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
              .m_rows;
      if (lVar6 < 0) goto LAB_0089bf70;
      if (lVar6 != 0) {
        memset((pCVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data,0,lVar6 << 3);
      }
      geometry::ChBasisToolsBspline::ComputeKnotUniformMultipleEnds(pCVar1,this->p,0.0,1.0);
    }
    this->closed = mc;
  }
  return;
}

Assistant:

void ChFunctionRotation_spline::SetClosed(bool mc) {
	if (this->closed == mc)
		return;

	// switch open->closed
	if (mc == true) {
		// add p control points to be wrapped: resize knots and control points
		auto n = this->rotations.size();
		n += p; 
		this->rotations.resize(n);
		this->knots.setZero(n + p + 1);
		
		// recompute knot vector spacing
        geometry::ChBasisToolsBspline::ComputeKnotUniform(this->knots, p);
		
		// wrap last control points
		for (int i = 0; i < p; ++i)
			this->rotations[n - p + i] = this->rotations[i];
	}
	
	// switch closed->open
	if (mc == false) {
		// remove p control points that was wrapped: resize knots and control points
		auto n = this->rotations.size();
		n -= p; 
		this->rotations.resize(n);
		this->knots.setZero(n + p + 1);

		// recompute knot vector spacing
        geometry::ChBasisToolsBspline::ComputeKnotUniformMultipleEnds(this->knots, p);
	}

	this->closed = mc;
}